

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O3

int Ivy_ObjMffcLabel(Ivy_Man_t *p,Ivy_Obj_t *pNode)

{
  int iVar1;
  int iVar2;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Ivy_IsComplement( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyUtil.c"
                  ,0x16a,"int Ivy_ObjMffcLabel(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  if ((*(uint *)&pNode->field_0x8 & 0xf) - 7 < 0xfffffffe) {
    __assert_fail("Ivy_ObjIsNode( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyUtil.c"
                  ,0x16b,"int Ivy_ObjMffcLabel(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  iVar1 = Ivy_ObjRefDeref(p,pNode,0,1);
  iVar2 = Ivy_ObjRefDeref(p,pNode,1,0);
  if (iVar1 != iVar2) {
    __assert_fail("nConeSize1 == nConeSize2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyUtil.c"
                  ,0x16e,"int Ivy_ObjMffcLabel(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  if (0 < iVar1) {
    return iVar1;
  }
  __assert_fail("nConeSize1 > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyUtil.c"
                ,0x16f,"int Ivy_ObjMffcLabel(Ivy_Man_t *, Ivy_Obj_t *)");
}

Assistant:

int Ivy_ObjMffcLabel( Ivy_Man_t * p, Ivy_Obj_t * pNode )
{
    int nConeSize1, nConeSize2;
    assert( !Ivy_IsComplement( pNode ) );
    assert( Ivy_ObjIsNode( pNode ) );
    nConeSize1 = Ivy_ObjRefDeref( p, pNode, 0, 1 ); // dereference
    nConeSize2 = Ivy_ObjRefDeref( p, pNode, 1, 0 ); // reference
    assert( nConeSize1 == nConeSize2 );
    assert( nConeSize1 > 0 );
    return nConeSize1;
}